

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

void global_motion_estimation(AV1_COMP *cpi)

{
  MotionModel *motion_models;
  uint8_t *segment_map;
  long in_RDI;
  FrameDistPair *unaff_retaddr;
  YV12_BUFFER_CONFIG **in_stack_00000008;
  AV1_COMP *in_stack_00000010;
  int dir;
  GlobalMotionData *gm_data;
  GlobalMotionInfo *gm_info;
  int local_1c;
  
  motion_models = (MotionModel *)(in_RDI + 0x60640);
  segment_map = (uint8_t *)(in_RDI + 0x3be28);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    if (0 < *(int *)((long)motion_models[1].params + (long)local_1c * 4 + 8)) {
      compute_global_motion_for_references
                (in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                 motion_models,segment_map,(int)gm_data,(int)gm_info);
    }
  }
  return;
}

Assistant:

static inline void global_motion_estimation(AV1_COMP *cpi) {
  GlobalMotionInfo *const gm_info = &cpi->gm_info;
  GlobalMotionData *gm_data = &cpi->td.gm_data;

  // Compute global motion w.r.t. past reference frames and future reference
  // frames
  for (int dir = 0; dir < MAX_DIRECTIONS; dir++) {
    if (gm_info->num_ref_frames[dir] > 0)
      compute_global_motion_for_references(
          cpi, gm_info->ref_buf, gm_info->reference_frames[dir],
          gm_info->num_ref_frames[dir], gm_data->motion_models,
          gm_data->segment_map, gm_info->segment_map_w, gm_info->segment_map_h);
  }
}